

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

size_t __thiscall Memory::Recycler::BackgroundFindRoots(Recycler *this)

{
  size_t *psVar1;
  size_t sVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  size_t sVar6;
  GuestArenaAllocator *pGVar7;
  size_t sVar8;
  DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *pDVar9;
  undefined1 local_40 [8];
  EditingIterator guestArenaIter;
  
  sVar2 = (this->collectionStats).markData.markCount;
  if ((this->collectionState).value != CollectionStateConcurrentFindRoots) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f6,"(this->IsConcurrentFindRootState())",
                       "this->IsConcurrentFindRootState()");
    if (!bVar4) goto LAB_006860e8;
    *puVar5 = 0;
  }
  if (this->hasPendingConcurrentFindRoot == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f7,"(this->hasPendingConcurrentFindRoot)",
                       "this->hasPendingConcurrentFindRoot");
    if (!bVar4) goto LAB_006860e8;
    *puVar5 = 0;
  }
  if ((this->inPartialCollectMode == false) && (bVar4 = DoQueueTrackedObject(this), !bVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x15f9,"(this->inPartialCollectMode || this->DoQueueTrackedObject())",
                       "this->inPartialCollectMode || this->DoQueueTrackedObject()");
    if (!bVar4) {
LAB_006860e8:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  sVar6 = ScanPinnedObjects<true>(this);
  pDVar9 = &this->guestArenaList;
  local_40 = (undefined1  [8])pDVar9;
  guestArenaIter.super_Iterator.list = pDVar9;
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
LAB_00685fd4:
  if (pDVar9 == (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar4) goto LAB_006860e8;
    *puVar5 = 0;
    pDVar9 = guestArenaIter.super_Iterator.list;
  }
  guestArenaIter.super_Iterator.list =
       (pDVar9->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list;
  if ((undefined1  [8])guestArenaIter.super_Iterator.list == local_40) {
    guestArenaIter.super_Iterator.list =
         (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
    ScanImplicitRoots(this);
    this->hasPendingConcurrentFindRoot = false;
    ObservableValue<Memory::CollectionState>::SetValue
              (&this->collectionState,CollectionStateConcurrentMark);
    psVar1 = &(this->collectionStats).rootCount;
    *psVar1 = *psVar1 + ((this->collectionStats).markData.markCount - sVar2);
    return sVar6;
  }
  pGVar7 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                     ((Iterator *)local_40);
  if (pGVar7->pendingDelete == true) {
    pDVar9 = guestArenaIter.super_Iterator.list;
    if (this->hasPendingDeleteGuestArena == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1616,"(this->hasPendingDeleteGuestArena)",
                         "this->hasPendingDeleteGuestArena");
      if (!bVar4) goto LAB_006860e8;
      *puVar5 = 0;
      pDVar9 = guestArenaIter.super_Iterator.list;
    }
  }
  else {
    sVar8 = ScanArena(this,&(pGVar7->super_ArenaAllocator).
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                            .super_ArenaData,true);
    sVar6 = sVar6 + sVar8;
    pDVar9 = guestArenaIter.super_Iterator.list;
  }
  goto LAB_00685fd4;
}

Assistant:

size_t
Recycler::BackgroundFindRoots()
{
#ifdef RECYCLER_STATS
    size_t lastMarkCount = this->collectionStats.markData.markCount;
#endif

    size_t scanRootBytes = 0;
    Assert(this->IsConcurrentFindRootState());
    Assert(this->hasPendingConcurrentFindRoot);
#if ENABLE_PARTIAL_GC
    Assert(this->inPartialCollectMode || this->DoQueueTrackedObject());
#else
    Assert(this->DoQueueTrackedObject());
#endif

    // Only mark pinned object and guest arenas, which is where most of the roots are.
    // When we go back to the main thread to rescan, we will scan the rest of the root.

    // NOTE: purposefully not marking the transientPinnedObject there. as it is transient :)

    // background mark the pinned object. Since we are in concurrent find root state
    // the main thread won't delete any entries from the map, so concurrent read
    // to the map safe.

    GCETW(GC_BACKGROUNDSCANROOTS_START, (this));
    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::BackgroundFindRootsPhase);

    scanRootBytes += this->ScanPinnedObjects</*background = */true>();

    RECYCLER_PROFILE_EXEC_BACKGROUND_BEGIN(this, Js::FindRootArenaPhase);
    // background mark the guest arenas. Since we are in concurrent find root state
    // the main thread won't delete any arena, so concurrent reads to them are ok.
    DListBase<GuestArenaAllocator>::EditingIterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        GuestArenaAllocator& allocator = guestArenaIter.Data();
        if (allocator.pendingDelete)
        {
            // Skip guest arena that are already marked for delete
            Assert(this->hasPendingDeleteGuestArena);
            continue;
        }
        scanRootBytes += ScanArena(&allocator, true);
    }
    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::FindRootArenaPhase);

    this->ScanImplicitRoots();

    RECYCLER_PROFILE_EXEC_BACKGROUND_END(this, Js::BackgroundFindRootsPhase);
    this->hasPendingConcurrentFindRoot = false;
    this->SetCollectionState(CollectionStateConcurrentMark);

    GCETW(GC_BACKGROUNDSCANROOTS_STOP, (this));
    RECYCLER_STATS_ADD(this, rootCount, this->collectionStats.markData.markCount - lastMarkCount);

    return scanRootBytes;
}